

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O2

void __thiscall bitfoot::Bitfoot::AddRookMoves<false>(Bitfoot *this,uint64_t dests)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int to;
  ulong uVar6;
  int from;
  
  if ((dests != 0) && (uVar5 = this->pc[8], uVar5 != 0)) {
    for (; uVar5 != 0; uVar5 = uVar5 & uVar5 - 1) {
      lVar1 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar6 = ~this->pc[0] & this->slider[lVar1] & dests;
      while (uVar6 != 0) {
        lVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar6 = uVar6 & uVar6 - 1;
        from = (int)lVar1;
        to = (int)lVar2;
        bVar3 = Pinned<false>(this,from,to);
        if (!bVar3) {
          if ((int)(&_board)[lVar2] < 8) {
            iVar4 = StaticExchange<false,true>(this,from,to);
          }
          else {
            iVar4 = ValueOf((&_board)[lVar2]);
            iVar4 = iVar4 + -0x1e;
          }
          AddMove<false,(bitfoot::MoveType)1>(this,8,from,to,iVar4,(&_board)[lVar2],0);
        }
      }
    }
  }
  return;
}

Assistant:

inline void AddRookMoves(const uint64_t dests) {
    if (!dests || !pc[color|Rook]) {
      return;
    }

    uint64_t pieces = pc[color|Rook];
    uint64_t dest;
    int from;
    int to;

    while (pieces) {
      dest = (slider[PopLowSquare(pieces, from)] & dests & ~pc[color]);
      while (dest) {
        if (!Pinned<color>(from, PopLowSquare(dest, to))) {
          if (_board[to] >= Rook) {
            AddMove<color, Normal>((color|Rook), from, to,
                                   (ValueOf(_board[to]) - 30), _board[to], 0);
          }
          else {
            AddMove<color, Normal>((color|Rook), from, to,
                                   StaticExchange<color, true>(from, to),
                                   _board[to], 0);
          }
        }
      }
    }
  }